

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char **Args_1,
          char (*Args_2) [22],char **Args_3,char (*Args_4) [10],char **Args_5,char (*Args_6) [101],
          char **Args_7,char (*Args_8) [5],char **Args_9,char (*Args_10) [18])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [9])this,(char **)Args,(char (*) [22])Args_1,(char **)Args_2,
             (char (*) [10])Args_3,(char **)Args_4,(char (*) [101])Args_5,(char **)Args_6,
             (char (*) [5])Args_7,(char **)Args_8,(char (*) [18])Args_9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}